

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_find_best_sub_pixel_tree_pruned
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  byte bVar1;
  int iVar2;
  int *piVar3;
  ushort uVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  scale_factors *psVar11;
  int iVar12;
  MV *pMVar13;
  short sVar14;
  short sVar15;
  int16_t iVar16;
  int iVar17;
  short sVar18;
  short sVar19;
  MV MVar20;
  MV MVar21;
  SubpelMvLimits *mv_limits;
  ushort uVar22;
  bool bVar23;
  uint local_e0;
  MV left_mv;
  int dummy;
  MV right_mv;
  int local_c8;
  MV top_mv;
  MV bottom_right_mv;
  MV bottom_mv;
  int dummy_2;
  MV top_right_mv;
  MV top_left_mv;
  
  iVar10 = ms_params->allow_hp;
  bVar1 = ms_params->forced_stop;
  iVar2 = ms_params->iters_per_step;
  piVar3 = ms_params->cost_list;
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar11 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar11 = &cm->sf_identity;
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  bVar23 = false;
  if ((psVar11->x_scale_fp == -1) || (psVar11->y_scale_fp == -1)) {
LAB_001df241:
    if ((start_mv_stats == (FULLPEL_MV_STATS *)0x0) || (bVar23)) {
      if (bVar23) goto LAB_001df277;
      local_e0 = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
      local_c8 = 0;
    }
    else {
      local_e0 = start_mv_stats->err_cost + start_mv_stats->distortion;
      *distortion = start_mv_stats->distortion;
      *sse1 = start_mv_stats->sse;
      local_c8 = 0;
    }
  }
  else {
    if (psVar11->x_scale_fp == 0x4000) {
      bVar23 = psVar11->y_scale_fp != 0x4000;
      goto LAB_001df241;
    }
LAB_001df277:
    local_e0 = upsampled_setup_center_error(xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion);
    local_c8 = 1;
  }
  if (bVar1 == 3) {
    return local_e0;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar21 = *bestmv;
    if ((MVar21.row == (last_mv_search_list->as_mv).row) &&
       ((int)MVar21 >> 0x10 == (int)(last_mv_search_list->as_mv).col)) {
      return 0x7fffffff;
    }
    (last_mv_search_list->as_mv).row = MVar21.row;
    (last_mv_search_list->as_mv).col = MVar21.col;
  }
  mv_limits = &ms_params->mv_limits;
  sVar18 = start_mv.row;
  sVar19 = start_mv.col;
  top_mv.col = sVar19;
  if (((((piVar3 != (int *)0x0) && (*piVar3 != 0x7fffffff)) && (piVar3[1] != 0x7fffffff)) &&
      ((piVar3[2] != 0x7fffffff && (piVar3[3] != 0x7fffffff)))) && (piVar3[4] != 0x7fffffff)) {
    bottom_mv.col = sVar19 + -4;
    left_mv.col = bottom_mv.col;
    left_mv.row = sVar18;
    bottom_right_mv.col = sVar19 + 4;
    dummy = CONCAT22(bottom_right_mv.col,sVar18);
    right_mv.row = sVar18 + 4;
    top_mv.row = sVar18 + -4;
    right_mv.col = sVar19;
    bottom_right_mv.row = right_mv.row;
    bottom_mv.row = right_mv.row;
    iVar10 = (*(code *)(&DAT_004ea2cc +
                       *(int *)(&DAT_004ea2cc +
                               (ulong)((uint)(piVar3[3] <= piVar3[1]) +
                                      (uint)(piVar3[4] <= piVar3[2]) * 2) * 4)))(xd);
    return iVar10;
  }
  iVar17 = (int)start_mv >> 0x10;
  left_mv.col = sVar19 + -4;
  left_mv.row = sVar18;
  dummy = 0;
  uVar6 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                            ,distortion,&dummy,local_c8);
  right_mv.col = sVar19 + 4;
  right_mv.row = sVar18;
  uVar7 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,&dummy,local_c8);
  top_mv.row = sVar18 + -4;
  uVar8 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                            distortion,&dummy,local_c8);
  bottom_mv.row = sVar18 + 4;
  bottom_mv.col = sVar19;
  uVar9 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,&dummy,local_c8);
  sVar5 = -4;
  if (uVar9 < uVar8) {
    sVar5 = 4;
  }
  sVar14 = -4;
  if (uVar7 < uVar6) {
    sVar14 = 4;
  }
  bottom_right_mv.row = sVar5 + sVar18;
  bottom_right_mv.col = sVar14 + sVar19;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                    ,distortion,&dummy,local_c8);
  if (1 < iVar2) {
    sVar19 = bestmv->row;
    sVar15 = bestmv->col;
    iVar12 = (int)sVar15;
    left_mv.row = 0;
    left_mv.col = 0;
    if (iVar17 == iVar12 || sVar18 == sVar19) {
      if (sVar18 == sVar19 && iVar17 != iVar12) {
        right_mv.col = sVar15 + sVar14;
        dummy = CONCAT22(right_mv.col,sVar19 + 4);
        right_mv.row = sVar19 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                          distortion,(int *)&left_mv,local_c8);
        top_mv.row = sVar19 - sVar5;
        pMVar13 = &top_mv;
        top_mv.col = sVar15;
      }
      else {
        if (sVar18 == sVar19 || iVar17 != iVar12) goto LAB_001df90e;
        right_mv.row = sVar5 + sVar19;
        dummy = CONCAT22(sVar15 + 4,right_mv.row);
        right_mv.col = sVar15 + -4;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                          distortion,(int *)&left_mv,local_c8);
        pMVar13 = &top_mv;
        top_mv.row = sVar19;
        top_mv.col = sVar15 - sVar14;
      }
    }
    else {
      dummy = CONCAT22(sVar15 + sVar14,sVar19);
      right_mv.row = sVar19 + sVar5;
      right_mv.col = sVar15;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                        ,distortion,(int *)&left_mv,local_c8);
      pMVar13 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar13,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                      distortion,(int *)&left_mv,local_c8);
  }
LAB_001df90e:
  if (1 < bVar1) {
    return local_e0;
  }
  MVar21 = *bestmv;
  iVar16 = MVar21.col;
  if (last_mv_search_list != (int_mv *)0x0) {
    if ((MVar21.row == last_mv_search_list[1].as_mv.row) &&
       ((int)MVar21 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 6))) {
      return 0x7fffffff;
    }
    last_mv_search_list[1].as_mv.row = MVar21.row;
    *(int16_t *)((long)last_mv_search_list + 6) = iVar16;
    MVar21.col = 0;
    MVar21.row = bestmv->row;
    iVar16 = bestmv->col;
  }
  sVar19 = MVar21.row;
  left_mv.col = iVar16 + -2;
  left_mv.row = sVar19;
  dummy = 0;
  uVar6 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                            ,distortion,&dummy,local_c8);
  right_mv.row = sVar19;
  right_mv.col = iVar16 + 2;
  uVar7 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,&dummy,local_c8);
  top_mv.row = sVar19 + -2;
  top_mv.col = iVar16;
  uVar8 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                            distortion,&dummy,local_c8);
  bottom_mv.row = sVar19 + 2;
  bottom_mv.col = iVar16;
  uVar9 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,&dummy,local_c8);
  bottom_right_mv.row = sVar19 + (ushort)(uVar9 < uVar8) * 4 + -2;
  bottom_right_mv.col = iVar16 + -2 + (ushort)(uVar7 < uVar6) * 4;
  check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                    ,distortion,&dummy,local_c8);
  if (1 < iVar2) {
    sVar14 = (ushort)(uVar9 < uVar8) * 4 + -2;
    sVar15 = (ushort)(uVar7 < uVar6) * 4 + -2;
    sVar18 = bestmv->row;
    sVar5 = bestmv->col;
    left_mv.row = 0;
    left_mv.col = 0;
    if (iVar16 == sVar5 || sVar19 == sVar18) {
      if (sVar19 == sVar18 && iVar16 != sVar5) {
        right_mv.col = sVar15 + sVar5;
        dummy = CONCAT22(right_mv.col,sVar19 + 2);
        right_mv.row = sVar19 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                          distortion,(int *)&left_mv,local_c8);
        top_mv.row = sVar19 - sVar14;
        pMVar13 = &top_mv;
        top_mv.col = sVar5;
      }
      else {
        if (sVar19 == sVar18 || iVar16 != sVar5) goto LAB_001dff34;
        right_mv.row = sVar14 + sVar18;
        dummy = CONCAT22(iVar16 + 2,right_mv.row);
        right_mv.col = iVar16 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                          distortion,(int *)&left_mv,local_c8);
        pMVar13 = &top_mv;
        top_mv.row = sVar18;
        top_mv.col = iVar16 - sVar15;
      }
    }
    else {
      dummy = CONCAT22(sVar15 + sVar5,sVar18);
      right_mv.row = sVar14 + sVar18;
      right_mv.col = sVar5;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1
                        ,distortion,(int *)&left_mv,local_c8);
      pMVar13 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar13,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                      distortion,(int *)&left_mv,local_c8);
  }
LAB_001dff34:
  if (bVar1 == 0 && iVar10 != 0) {
    MVar20 = *bestmv;
    iVar16 = MVar20.col;
    if (last_mv_search_list != (int_mv *)0x0) {
      if ((MVar20.row == last_mv_search_list[2].as_mv.row) &&
         ((int)MVar20 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 10))) {
        return 0x7fffffff;
      }
      last_mv_search_list[2].as_mv.row = MVar20.row;
      *(int16_t *)((long)last_mv_search_list + 10) = iVar16;
      MVar20.col = 0;
      MVar20.row = bestmv->row;
      iVar16 = bestmv->col;
    }
    sVar19 = MVar20.row;
    left_mv.col = iVar16 + -1;
    left_mv.row = sVar19;
    dummy = 0;
    uVar6 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                              sse1,distortion,&dummy,local_c8);
    right_mv.row = sVar19;
    right_mv.col = iVar16 + 1;
    uVar7 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                              sse1,distortion,&dummy,local_c8);
    top_mv.row = sVar19 + -1;
    top_mv.col = iVar16;
    uVar8 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                              sse1,distortion,&dummy,local_c8);
    bottom_mv.row = sVar19 + 1;
    bottom_mv.col = iVar16;
    uVar9 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                              sse1,distortion,&dummy,local_c8);
    uVar22 = (uVar9 < uVar8) - 1 | 1;
    bottom_right_mv.row = sVar19 + uVar22;
    uVar4 = (uVar7 < uVar6) - 1 | 1;
    bottom_right_mv.col = iVar16 + uVar4;
    check_better_fast(xd,cm,&bottom_right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                      sse1,distortion,&dummy,local_c8);
    if (1 < iVar2) {
      sVar18 = bestmv->row;
      sVar5 = bestmv->col;
      left_mv.row = 0;
      left_mv.col = 0;
      if (iVar16 == sVar5 || sVar19 == sVar18) {
        if (sVar19 == sVar18 && iVar16 != sVar5) {
          right_mv.col = sVar5 + uVar4;
          dummy = CONCAT22(right_mv.col,sVar19 + 1);
          right_mv.row = sVar19 + -1;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,(int *)&left_mv,local_c8);
          top_mv.row = sVar19 - uVar22;
          pMVar13 = &top_mv;
          top_mv.col = sVar5;
        }
        else {
          if (sVar19 == sVar18 || iVar16 != sVar5) {
            return local_e0;
          }
          right_mv.row = uVar22 + sVar18;
          dummy = CONCAT22(iVar16 + 1,right_mv.row);
          right_mv.col = iVar16 + -1;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                            sse1,distortion,(int *)&left_mv,local_c8);
          pMVar13 = &top_mv;
          top_mv.row = sVar18;
          top_mv.col = iVar16 - uVar4;
        }
      }
      else {
        dummy = CONCAT22(sVar5 + uVar4,sVar18);
        right_mv.row = uVar22 + sVar18;
        right_mv.col = sVar5;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,
                          sse1,distortion,(int *)&left_mv,local_c8);
        pMVar13 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar13,bestmv,mv_limits,var_params,mv_cost_params,&local_e0,sse1,
                        distortion,(int *)&left_mv,local_c8);
    }
  }
  return local_e0;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX) {
    const unsigned int whichdir = (cost_list[1] < cost_list[3] ? 0 : 1) +
                                  (cost_list[2] < cost_list[4] ? 0 : 2);

    const MV left_mv = { start_mv.row, start_mv.col - hstep };
    const MV right_mv = { start_mv.row, start_mv.col + hstep };
    const MV bottom_mv = { start_mv.row + hstep, start_mv.col };
    const MV top_mv = { start_mv.row - hstep, start_mv.col };

    const MV bottom_left_mv = { start_mv.row + hstep, start_mv.col - hstep };
    const MV bottom_right_mv = { start_mv.row + hstep, start_mv.col + hstep };
    const MV top_left_mv = { start_mv.row - hstep, start_mv.col - hstep };
    const MV top_right_mv = { start_mv.row - hstep, start_mv.col + hstep };

    int dummy = 0;

    switch (whichdir) {
      case 0:  // bottom left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_left_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 1:  // bottom right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_right_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 2:  // top left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
      case 3:  // top right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}